

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O1

bool __thiscall
timertt::details::
timer_list_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>
::
activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (timer_list_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>
           *this,timer_object_holder<timertt::thread_safety::unsafe> *timer,
          duration<long,_std::ratio<1L,_1000000000L>_> pause,
          duration<long,_std::ratio<1L,_1000000000L>_> period,timer_action *action)

{
  reference_counter_type *prVar1;
  timer_type *timer_00;
  long lVar2;
  
  timer_00 = timer_object_holder<timertt::thread_safety::unsafe>::
             cast_to<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>::timer_type>
                       (timer);
  timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ::ensure_timer_deactivated(timer_00);
  std::function<void_()>::operator=(&timer_00->m_action,action);
  lVar2 = std::chrono::_V2::steady_clock::now();
  (timer_00->m_when).__d.__r = lVar2 + pause.__r;
  (timer_00->m_period).__r = period.__r;
  prVar1 = &(timer_00->super_timer_object<timertt::thread_safety::unsafe>).m_references;
  *prVar1 = *prVar1 + 1;
  *(undefined4 *)&(timer_00->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 1;
  timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ::insert_timer_to_list
            ((timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
              *)this,timer_00);
  *(long *)(this + (ulong)((timer_00->m_period).__r != 0) * 8 + 0x40) =
       *(long *)(this + (ulong)((timer_00->m_period).__r != 0) * 8 + 0x40) + 1;
  return timer_00 == *(timer_type **)(this + 0x50);
}

Assistant:

bool
	activate(
		//! Timer to be activated.
		timer_object_holder< THREAD_SAFETY > timer,
		//! Pause for timer execution.
		DURATION_1 pause,
		//! Repetition period.
		//! If <tt>DURATION_2::zero() == period</tt> then timer will be
		//! single-shot.
		DURATION_2 period,
		//! Action for the timer.
		timer_action action )
	{
		auto list_timer = timer.template cast_to< timer_type >();
		ensure_timer_deactivated( list_timer );

		// Timer object must be correctly (re)initialized.
		list_timer->m_action = std::move( action );
		list_timer->m_when = monotonic_clock::now() + pause;
		list_timer->m_period = std::chrono::duration_cast<
				monotonic_clock::duration >( period );

		// Timer must be taken under control.
		timer_object< THREAD_SAFETY >::increment_references( list_timer );
		// It is an active timer now.
		list_timer->m_status = timer_status::active;

		insert_timer_to_list( list_timer );
		// Count of timers in the list changed.
		this->inc_timer_count( list_timer->kind() );

		return list_timer == m_head;
	}